

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedDynamicMachine.hpp
# Opt level: O0

ScanProducer * __thiscall
Machine::TypedDynamicMachine<MSX::Machine>::get<MachineTypes::ScanProducer>
          (TypedDynamicMachine<MSX::Machine> *this)

{
  pointer pMVar1;
  ScanProducer *local_20;
  TypedDynamicMachine<MSX::Machine> *this_local;
  
  pMVar1 = std::unique_ptr<MSX::Machine,_std::default_delete<MSX::Machine>_>::get(&this->machine_);
  if (pMVar1 == (pointer)0x0) {
    local_20 = (ScanProducer *)0x0;
  }
  else {
    local_20 = (ScanProducer *)
               __dynamic_cast(pMVar1,&MSX::Machine::typeinfo,&MachineTypes::ScanProducer::typeinfo,
                              0xfffffffffffffffe);
  }
  return local_20;
}

Assistant:

Class *get() {
			return dynamic_cast<Class *>(machine_.get());

			// Note to self: the below is not [currently] used
			// because in practice TypedDynamicMachine is instantiated
			// with an abstract parent of the actual class.
			//
			// TODO: rethink type hiding here. I think I've boxed myself
			// into an uncomfortable corner.
//			if constexpr (std::is_base_of_v<Class, T>) {
//				return static_cast<Class *>(machine_.get());
//			} else {
//				return nullptr;
//			}
		}